

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PoslistMerge(char **pp,char **pp1,char **pp2)

{
  int iVar1;
  char **in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int n;
  sqlite3_int64 iPrev;
  sqlite3_int64 i2;
  sqlite3_int64 i1;
  int iCol2;
  int iCol1;
  char *p2;
  char *p1;
  char *p;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  char **in_stack_ffffffffffffff90;
  undefined3 uVar2;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int local_44;
  uint local_28;
  uint local_24;
  char *local_20;
  char *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (undefined1 *)*in_RDI;
  local_18 = (char *)*in_RSI;
  local_20 = *in_RDX;
  while( true ) {
    uVar2 = (undefined3)in_stack_ffffffffffffff98;
    in_stack_ffffffffffffff98 = CONCAT13(1,uVar2);
    if (*local_18 == '\0') {
      in_stack_ffffffffffffff98 = CONCAT13(*local_20 != '\0',uVar2);
    }
    if ((char)((uint)in_stack_ffffffffffffff98 >> 0x18) == '\0') goto LAB_0024f5c0;
    local_24 = 0xaaaaaaaa;
    local_28 = 0xaaaaaaaa;
    if (*local_18 == '\x01') {
      if ((local_18[1] & 0x80U) == 0) {
        local_24 = (uint)(byte)local_18[1];
      }
      else {
        sqlite3Fts3GetVarint32(local_18 + 1,(int *)&local_24);
      }
      if (local_24 == 0) {
        local_44 = 0x10b;
        goto LAB_0024f60b;
      }
    }
    else if (*local_18 == '\0') {
      local_24 = 0x7fffffff;
    }
    else {
      local_24 = 0;
    }
    if (*local_20 == '\x01') {
      if ((local_20[1] & 0x80U) == 0) {
        local_28 = (uint)(byte)local_20[1];
      }
      else {
        sqlite3Fts3GetVarint32(local_20 + 1,(int *)&local_28);
      }
      if (local_28 == 0) {
        local_44 = 0x10b;
        goto LAB_0024f60b;
      }
    }
    else if (*local_20 == '\0') {
      local_28 = 0x7fffffff;
    }
    else {
      local_28 = 0;
    }
    if (local_24 == local_28) break;
    if ((int)local_24 < (int)local_28) {
      iVar1 = fts3PutColNumber(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      local_18 = local_18 + iVar1;
      fts3ColumnlistCopy(in_RDX,(char **)CONCAT44(in_stack_ffffffffffffff9c,
                                                  in_stack_ffffffffffffff98));
    }
    else {
      iVar1 = fts3PutColNumber(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      local_20 = local_20 + iVar1;
      fts3ColumnlistCopy(in_RDX,(char **)CONCAT44(in_stack_ffffffffffffff9c,
                                                  in_stack_ffffffffffffff98));
    }
  }
  iVar1 = fts3PutColNumber(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  local_18 = local_18 + iVar1;
  local_20 = local_20 + iVar1;
  fts3GetDeltaVarint(in_stack_ffffffffffffff90,
                     (sqlite3_int64 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
  ;
  fts3GetDeltaVarint(in_stack_ffffffffffffff90,
                     (sqlite3_int64 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
  ;
LAB_0024f5c0:
  *local_10 = 0;
  *in_RDI = local_10 + 1;
  *in_RSI = local_18 + 1;
  *in_RDX = local_20 + 1;
  local_44 = 0;
  local_10 = local_10 + 1;
LAB_0024f60b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_44;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3PoslistMerge(
  char **pp,                      /* Output buffer */
  char **pp1,                     /* Left input list */
  char **pp2                      /* Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;

  while( *p1 || *p2 ){
    int iCol1;         /* The current column index in pp1 */
    int iCol2;         /* The current column index in pp2 */

    if( *p1==POS_COLUMN ){
      fts3GetVarint32(&p1[1], &iCol1);
      if( iCol1==0 ) return FTS_CORRUPT_VTAB;
    }
    else if( *p1==POS_END ) iCol1 = 0x7fffffff;
    else iCol1 = 0;

    if( *p2==POS_COLUMN ){
      fts3GetVarint32(&p2[1], &iCol2);
      if( iCol2==0 ) return FTS_CORRUPT_VTAB;
    }
    else if( *p2==POS_END ) iCol2 = 0x7fffffff;
    else iCol2 = 0;

    if( iCol1==iCol2 ){
      sqlite3_int64 i1 = 0;       /* Last position from pp1 */
      sqlite3_int64 i2 = 0;       /* Last position from pp2 */
      sqlite3_int64 iPrev = 0;
      int n = fts3PutColNumber(&p, iCol1);
      p1 += n;
      p2 += n;

      /* At this point, both p1 and p2 point to the start of column-lists
      ** for the same column (the column with index iCol1 and iCol2).
      ** A column-list is a list of non-negative delta-encoded varints, each
      ** incremented by 2 before being stored. Each list is terminated by a
      ** POS_END (0) or POS_COLUMN (1). The following block merges the two lists
      ** and writes the results to buffer p. p is left pointing to the byte
      ** after the list written. No terminator (POS_END or POS_COLUMN) is
      ** written to the output.
      */
      fts3GetDeltaVarint(&p1, &i1);
      fts3GetDeltaVarint(&p2, &i2);
      if( i1<2 || i2<2 ){
        break;
      }
      do {
        fts3PutDeltaVarint(&p, &iPrev, (i1<i2) ? i1 : i2);
        iPrev -= 2;
        if( i1==i2 ){
          fts3ReadNextPos(&p1, &i1);
          fts3ReadNextPos(&p2, &i2);
        }else if( i1<i2 ){
          fts3ReadNextPos(&p1, &i1);
        }else{
          fts3ReadNextPos(&p2, &i2);
        }
      }while( i1!=POSITION_LIST_END || i2!=POSITION_LIST_END );
    }else if( iCol1<iCol2 ){
      p1 += fts3PutColNumber(&p, iCol1);
      fts3ColumnlistCopy(&p, &p1);
    }else{
      p2 += fts3PutColNumber(&p, iCol2);
      fts3ColumnlistCopy(&p, &p2);
    }
  }

  *p++ = POS_END;
  *pp = p;
  *pp1 = p1 + 1;
  *pp2 = p2 + 1;
  return SQLITE_OK;
}